

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.hh
# Opt level: O0

void __thiscall tchecker::vm_t::push<int>(vm_t *this,int t)

{
  bool bVar1;
  runtime_error *this_00;
  long local_30 [3];
  int local_14;
  vm_t *pvStack_10;
  int t_local;
  vm_t *this_local;
  
  local_14 = t;
  pvStack_10 = this;
  bVar1 = contains_value<long,int>(t);
  if (!bVar1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"vm_t::push, value out-of-bounds");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_30[0] = (long)local_14;
  std::vector<long,_std::allocator<long>_>::push_back(&this->_stack,local_30);
  return;
}

Assistant:

inline void push(T t)
  {
    if (!contains_value<tchecker::bytecode_t>(t))
      throw std::runtime_error("vm_t::push, value out-of-bounds");
    _stack.push_back(t);
  }